

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

int __thiscall BER_CONTAINER::fromBuffer(BER_CONTAINER *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (max_len < 2) {
    iVar4 = -0xc;
  }
  else if (this->_type == (uint)*buf) {
    uVar2 = (uint)buf[1];
    if ((char)buf[1] < '\0') {
      uVar3 = uVar2 & 0x7f;
      uVar1 = uVar2 & 0x7f;
      uVar2 = 0;
      for (lVar5 = 0; uVar1 != (uint)lVar5; lVar5 = lVar5 + 1) {
        uVar2 = uVar2 << 8 | (uint)buf[lVar5 + 2];
      }
      this->_length = uVar2;
      iVar4 = uVar3 + 1;
    }
    else {
      this->_length = uVar2;
      iVar4 = 1;
    }
    if ((long)(int)uVar2 + 2U <= max_len) {
      return iVar4 + 1;
    }
    iVar4 = -0xb;
  }
  else {
    iVar4 = -0xf;
  }
  return iVar4;
}

Assistant:

int BER_CONTAINER::fromBuffer(const uint8_t *buf, size_t max_len) {
    // In the base class we are going to double check our type, and decode the length of this structure, then return bytes read
    if(max_len < 2) return SNMP_BUFFER_ERROR_TLV_TOO_SMALL; // Too small for any type

    const uint8_t* ptr = buf;
    if(*ptr != _type){
        SNMP_LOGE("Mismatched type when decoding %d, %d\n", _type, *ptr);
        return SNMP_BUFFER_ERROR_TYPE_MISMATCH;
    }
    ptr++; // type
    ptr += decode_ber_length_integer(ptr, &_length, max_len);
    if((size_t)_length + 2 > max_len){
        // length of object is too big to read in
        return SNMP_BUFFER_ERROR_MAX_LEN_EXCEEDED;
    }

    return ptr - buf;
}